

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O1

void __thiscall
Hpipe::InstructionGraph::make_rewind_exec
          (InstructionGraph *this,InstructionMark *mark,InstructionRewind *rewind)

{
  PendingRewindTrans *pPVar1;
  uint *puVar2;
  InstructionMark *pIVar3;
  InstructionMark *pIVar4;
  Instruction *pIVar5;
  int iVar6;
  iterator iVar7;
  Instruction *pIVar8;
  const_iterator cVar9;
  _Base_ptr p_Var10;
  pointer pTVar11;
  _Rb_tree_header *p_Var12;
  uint *puVar13;
  bool bVar14;
  PendingRewindTrans pt;
  Vec<unsigned_int> keep_ind;
  anon_class_32_4_fc640c73 reg;
  deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  pending_trans;
  map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
  instruction_map;
  InstructionMark *local_1a0;
  Instruction *local_198;
  undefined8 uStack_190;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_188;
  Transition local_170;
  Vec<unsigned_int> local_148;
  Vec<unsigned_int> *local_128;
  Vec<unsigned_int> local_120;
  Vec<unsigned_int> local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  anon_class_32_4_fc640c73 local_d8;
  _Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  local_b8;
  _Rb_tree<Hpipe::InstructionGraph::RewindContext,_std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>,_std::_Select1st<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1a0 = mark;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  ::_M_initialize_map(&local_b8,0);
  local_d8.instruction_map =
       (map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
        *)&local_60;
  local_d8.mark = &local_1a0;
  local_d8.this = this;
  local_d8.pending_trans =
       (deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
        *)&local_b8;
  range_vec<unsigned_int>
            (&local_120,
             (uint)((ulong)((long)*(pointer *)
                                   ((long)&(rewind->super_Instruction).cx.pos.
                                           super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                           .
                                           super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                           ._M_impl.super__Vector_impl_data + 8) -
                           (long)(rewind->super_Instruction).cx.pos.
                                 super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                 .
                                 super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3));
  make_rewind_exec::anon_class_32_4_fc640c73::operator()
            (&local_d8,&rewind->super_Instruction,&local_120);
  if (local_120.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_128 = &(rewind->super_Instruction).cx.paths_to_mark;
    do {
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pPVar1 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_198 = pPVar1[0x1f].new_inst;
        uStack_190._0_4_ = pPVar1[0x1f].num_prev;
        uStack_190._4_4_ = pPVar1[0x1f].num_next;
        operator_delete(local_b8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_198 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].new_inst;
        uStack_190._0_4_ = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].num_prev;
        uStack_190._4_4_ = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].num_next;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar11 = (local_198->orig->prev).
                super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                super__Vector_impl_data._M_start + (uStack_190 & 0xffffffff);
      puVar2 = (local_198->orig_keed_ind).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar13 = (local_198->orig_keed_ind).
                     super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar13 != puVar2; puVar13 = puVar13 + 1) {
        Vec<unsigned_int>::push_back_unique<unsigned_int&>
                  ((Vec<unsigned_int> *)&local_188,
                   (uint *)((ulong)*puVar13 * 4 +
                           *(long *)&(pTVar11->rcitem).
                                     super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ));
      }
      local_170.inst = pTVar11->inst;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_170.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                 &local_188);
      iVar7 = std::
              _Rb_tree<Hpipe::InstructionGraph::RewindContext,_std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>,_std::_Select1st<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
              ::find(&local_60,(key_type *)&local_170);
      if (local_170.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_170.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_170.rcitem.
                              super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_170.rcitem.
                              super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((_Rb_tree_header *)iVar7._M_node == &local_60._M_impl.super__Rb_tree_header) {
        pIVar8 = pTVar11->inst;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_f0,&local_188);
        pIVar8 = make_rewind_exec::anon_class_32_4_fc640c73::operator()
                           (&local_d8,pIVar8,(Vec<unsigned_int> *)&local_f0);
      }
      else {
        pIVar8 = *(Instruction **)(iVar7._M_node + 2);
      }
      if (((_Rb_tree_header *)iVar7._M_node == &local_60._M_impl.super__Rb_tree_header) &&
         (local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_f0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      Vec<Hpipe::Vec<Hpipe::Transition>>::secure_push_back<Hpipe::Instruction*>
                ((Vec<Hpipe::Vec<Hpipe::Transition>> *)&pIVar8->next_rw,uStack_190._4_4_,&local_198)
      ;
      pIVar5 = local_198;
      local_148.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Transition::Transition(&local_170,pIVar8,&local_148,-1.0);
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Transition_const&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar5->prev,
                 &local_170);
      if (local_170.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_170.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_170.rcitem.
                              super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_170.rcitem.
                              super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_148.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_148.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pIVar4 = local_1a0;
      pIVar3 = (InstructionMark *)pTVar11->inst;
      if (pIVar3 == local_1a0) {
        Vec<unsigned_int>::uniqued(&local_108,local_128);
        if ((long)local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
            (long)local_108.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_108.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) goto LAB_001649ac;
        if (local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          bVar14 = true;
        }
        else {
          iVar6 = bcmp(local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       local_108.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (long)local_188.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_188.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
          bVar14 = iVar6 == 0;
        }
      }
      else {
LAB_001649ac:
        bVar14 = false;
      }
      if ((pIVar3 == pIVar4) &&
         (local_108.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_108.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (bVar14) {
        rewind->exec = pIVar8;
      }
      if (local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_188.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  p_Var10 = *(_Base_ptr *)
             ((long)&(local_1a0->super_Instruction).cx.paths_to_strings._M_t._M_impl.
                     super__Rb_tree_header._M_header + 0x10);
  p_Var12 = &(local_1a0->super_Instruction).cx.paths_to_strings._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var12) {
    do {
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
              ::find(&(rewind->super_Instruction).cx.paths_to_strings._M_t,(key_type *)(p_Var10 + 1)
                    );
      if ((_Rb_tree_header *)cVar9._M_node ==
          &(rewind->super_Instruction).cx.paths_to_strings._M_t._M_impl.super__Rb_tree_header) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &rewind->strs_to_cancel,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var10 + 1));
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var12);
  }
  std::
  _Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  ::~_Deque_base(&local_b8);
  std::
  _Rb_tree<Hpipe::InstructionGraph::RewindContext,_std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>,_std::_Select1st<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void InstructionGraph::make_rewind_exec( InstructionMark *mark, InstructionRewind *rewind ) {
    // we start from the end
    std::map<RewindContext,Instruction *> instruction_map; // [ orig, keep_ind ] => new instruction
    std::deque<PendingRewindTrans> pending_trans; //

    auto reg = [&]( Instruction *orig, Vec<unsigned> orig_keep_ind ) {
        Instruction *new_inst = orig->clone( inst_pool, orig->cx.keep_only( orig_keep_ind ).first.without_mark().first, orig_keep_ind );
        instruction_map[ RewindContext{ orig, orig_keep_ind } ] = new_inst;
        new_inst->running_strs = orig->running_strs;
        new_inst->orig_keed_ind = orig_keep_ind;
        new_inst->orig = orig;

        // look into prevs
        if ( orig != mark ) {
            std::set<Instruction *> prevs;
            for( unsigned num_prev = 0; num_prev < orig->prev.size(); ++num_prev ) {
                Instruction *prev = orig->prev[ num_prev ].inst;
                if ( prevs.count( prev ) )
                    continue;
                prevs.insert( prev );
                for( unsigned num_next = 0; num_next < prev->next.size(); ++num_next )
                    if ( prev->next[ num_next ].inst == orig )
                        pending_trans.emplace_back( new_inst, num_prev, num_next );
            }
        }

        return new_inst;
    };

    reg( rewind, range_vec( unsigned( rewind->cx.pos.size() ) ) );
    while ( ! pending_trans.empty() ) {
        PendingRewindTrans pt = pending_trans.back();
        pending_trans.pop_back();

        Vec<unsigned> keep_ind;
        Transition &t = pt.new_inst->orig->prev[ pt.num_prev ];
        for( unsigned keep_ind_next : pt.new_inst->orig_keed_ind )
            keep_ind.push_back_unique( t.rcitem[ keep_ind_next ] );

        // make the new instruction if not already done
        auto iter = instruction_map.find( RewindContext{ t.inst, keep_ind } );
        Instruction *new_inst = iter == instruction_map.end() ? reg( t.inst, keep_ind ) : iter->second;

        // std::cout << pt.new_inst->orig->get_display_id() << "\t->\t" << t.inst->get_display_id() << "\tki=[" << keep_ind << "]:\t" << new_inst->get_display_id() << "\t-> " << *new_inst << std::endl;

        // register in the graph
        new_inst->next_rw.secure_push_back( pt.num_next, pt.new_inst );
        pt.new_inst->prev << new_inst;

        //
        if ( t.inst == mark && keep_ind == rewind->cx.paths_to_mark.uniqued() )
            rewind->exec = new_inst;
    }

    // strings present in mark but not in rewind
    for( const auto &mp : mark->cx.paths_to_strings )
        if ( ! rewind->cx.paths_to_strings.count( mp.first ) )
            rewind->strs_to_cancel << mp.first;
}